

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

llb_buildsystem_command_t *
llb_buildsystem_external_command_create
          (llb_data_t *name,llb_buildsystem_external_command_delegate_t delegate)

{
  llb_buildsystem_external_command_delegate_t delegate_00;
  undefined1 auVar1 [64];
  CAPIExternalCommand *this;
  bool local_a1;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  _func_void_void_ptr *p_Stack_40;
  StringRef local_38;
  llb_data_t *local_28;
  llb_data_t *name_local;
  uint8_t *local_18;
  StringRef *local_10;
  
  auVar1 = (undefined1  [64])delegate._32_64_;
  local_28 = name;
  if (delegate.start ==
      (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t
       *)0x0) {
    __assert_fail("delegate.start",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                  ,0x52e,
                  "llb_buildsystem_command_t *llb_buildsystem_external_command_create(const llb_data_t *, llb_buildsystem_external_command_delegate_t)"
                 );
  }
  delegate._32_64_ = auVar1;
  if (delegate.provide_value !=
      (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t_llb_build_value_ptr_uintptr_t
       *)0x0) {
    local_a1 = true;
    if (delegate.execute_command ==
        (_func_llb_buildsystem_command_result_t_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t_llb_buildsystem_queue_job_context_t_ptr
         *)0x0) {
      local_a1 = delegate.execute_command_detached !=
                 (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t_llb_buildsystem_queue_job_context_t_ptr_void_ptr__func_void_void_ptr_llb_buildsystem_command_result_t_llb_build_value_ptr_ptr
                  *)0x0;
    }
    if (!local_a1) {
      __assert_fail("delegate.execute_command || delegate.execute_command_detached",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                    ,0x530,
                    "llb_buildsystem_command_t *llb_buildsystem_external_command_create(const llb_data_t *, llb_buildsystem_external_command_delegate_t)"
                   );
    }
    this = (CAPIExternalCommand *)operator_new(0x238);
    local_18 = local_28->data;
    name_local = (llb_data_t *)local_28->length;
    local_10 = &local_38;
    local_38.Data = (char *)local_18;
    local_38.Length = (size_t)name_local;
    memcpy(&local_98,&delegate,0x60);
    delegate_00.configure =
         (_func_void_void_ptr_llb_buildsystem_command_t_ptr__func_void_llb_buildsystem_command_t_ptr_llb_data_t_llb_data_t_ptr__func_void_llb_buildsystem_command_t_ptr_llb_data_t_llb_data_t_ptr_size_t_ptr__func_void_llb_buildsystem_command_t_ptr_llb_data_t_llb_data_t_ptr_llb_data_t_ptr_size_t_ptr
          *)uStack_90;
    delegate_00.context = (void *)local_98;
    delegate_00.get_signature =
         (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_data_t_ptr *)local_88;
    delegate_00.start =
         (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t
          *)uStack_80;
    delegate_00.provide_value =
         (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t_llb_build_value_ptr_uintptr_t
          *)local_78;
    delegate_00.execute_command =
         (_func_llb_buildsystem_command_result_t_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t_llb_buildsystem_queue_job_context_t_ptr
          *)uStack_70;
    delegate_00.execute_command_ex =
         (_func_llb_build_value_ptr_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t_llb_buildsystem_queue_job_context_t_ptr
          *)local_68;
    delegate_00.execute_command_detached =
         (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t_llb_buildsystem_queue_job_context_t_ptr_void_ptr__func_void_void_ptr_llb_buildsystem_command_result_t_llb_build_value_ptr_ptr
          *)uStack_60;
    delegate_00.cancel_detached_command =
         (_func_void_void_ptr_llb_buildsystem_command_t_ptr *)local_58;
    delegate_00.is_result_valid =
         (_func_bool_void_ptr_llb_buildsystem_command_t_ptr_llb_build_value_ptr *)uStack_50;
    delegate_00.is_result_valid_with_fallback =
         (_func_bool_void_ptr_llb_buildsystem_command_t_ptr_llb_build_value_ptr_void_ptr__func_bool_void_ptr_llb_buildsystem_command_t_ptr_llb_build_value_ptr_ptr
          *)local_48;
    delegate_00.destroy_context = p_Stack_40;
    anon_unknown.dwarf_1b8a13::CAPIExternalCommand::CAPIExternalCommand(this,local_38,delegate_00);
    return (llb_buildsystem_command_t *)this;
  }
  __assert_fail("delegate.provide_value",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                ,0x52f,
                "llb_buildsystem_command_t *llb_buildsystem_external_command_create(const llb_data_t *, llb_buildsystem_external_command_delegate_t)"
               );
}

Assistant:

llb_buildsystem_command_t*
llb_buildsystem_external_command_create(
    const llb_data_t* name,
    llb_buildsystem_external_command_delegate_t delegate) {
  // Check that all required methods are provided.
  assert(delegate.start);
  assert(delegate.provide_value);
  assert(delegate.execute_command || delegate.execute_command_detached);
  
  return (llb_buildsystem_command_t*) new CAPIExternalCommand(
      StringRef((const char*)name->data, name->length), delegate);
}